

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O1

int flatcc_emitter(void *emit_context,flatcc_iovec_t *iov,int iov_count,flatbuffers_soffset_t offset
                  ,size_t len)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong __n;
  size_t sVar7;
  flatcc_iovec_t *pfVar8;
  bool bVar9;
  void *local_40;
  ulong *local_38;
  
  *(long *)((long)emit_context + 0x30) = *(long *)((long)emit_context + 0x30) + len;
  if (offset < 0) {
    local_38 = (ulong *)((long)emit_context + 0x18);
    uVar5 = *(ulong *)((long)emit_context + 0x18);
    if (len <= uVar5) {
      pvVar3 = (void *)(*(long *)((long)emit_context + 0x10) - len);
      *(void **)((long)emit_context + 0x10) = pvVar3;
      goto LAB_0010788d;
    }
    if (iov_count == 0) {
      return 0;
    }
    pfVar8 = iov + iov_count;
    do {
      sVar7 = pfVar8[-1].iov_len;
      pfVar8 = pfVar8 + -1;
      if (sVar7 != 0) {
        local_40 = (void *)((long)pfVar8->iov_base + sVar7);
        bVar9 = false;
        do {
          uVar5 = *local_38;
          while ((uVar6 = sVar7, uVar5 < sVar7 && (uVar6 = uVar5, uVar5 == 0))) {
            lVar1 = *emit_context;
            if ((lVar1 == 0) ||
               (pvVar3 = *(void **)(lVar1 + 0xb88), pvVar3 == *(void **)((long)emit_context + 8))) {
              pvVar3 = malloc(0xb98);
              if (pvVar3 == (void *)0x0) {
                return -1;
              }
              *(long *)((long)emit_context + 0x38) = *(long *)((long)emit_context + 0x38) + 0xb80;
              if (lVar1 != 0) {
                lVar2 = *(long *)((long)emit_context + 8);
                *(long *)((long)pvVar3 + 0xb88) = lVar2;
                *(long *)((long)pvVar3 + 0xb80) = lVar1;
                *(void **)(lVar1 + 0xb88) = pvVar3;
                *(void **)(lVar2 + 0xb80) = pvVar3;
                goto LAB_001077af;
              }
              *(void **)emit_context = pvVar3;
              *(void **)((long)emit_context + 8) = pvVar3;
              *(void **)((long)pvVar3 + 0xb80) = pvVar3;
              *(void **)((long)pvVar3 + 0xb88) = pvVar3;
              uVar5 = 0x5c0;
              *(long *)((long)emit_context + 0x10) = (long)pvVar3 + 0x5c0;
              *(long *)((long)emit_context + 0x20) = (long)pvVar3 + 0x5c0;
              *(undefined8 *)((long)emit_context + 0x18) = 0x5c0;
              *(undefined8 *)((long)emit_context + 0x28) = 0x5c0;
              iVar4 = -0x5c0;
            }
            else {
              *(int *)((long)pvVar3 + 0xb90) = *(int *)(lVar1 + 0xb90) + -0xb80;
LAB_001077af:
              *(void **)emit_context = pvVar3;
              uVar5 = 0xb80;
              *(long *)((long)emit_context + 0x10) = (long)pvVar3 + 0xb80;
              *(undefined8 *)((long)emit_context + 0x18) = 0xb80;
              iVar4 = *(int *)(*(long *)((long)pvVar3 + 0xb80) + 0xb90) + -0xb80;
            }
            *(int *)((long)pvVar3 + 0xb90) = iVar4;
            if (bVar9) goto LAB_00107861;
          }
          pvVar3 = (void *)(*(long *)((long)emit_context + 0x10) - uVar6);
          *(void **)((long)emit_context + 0x10) = pvVar3;
          *(ulong *)((long)emit_context + 0x18) = uVar5 - uVar6;
          local_40 = (void *)((long)local_40 - uVar6);
          memcpy(pvVar3,local_40,uVar6);
          sVar7 = sVar7 - uVar6;
          bVar9 = sVar7 == 0;
        } while (!bVar9);
      }
LAB_00107861:
      iov_count = iov_count + -1;
    } while (iov_count != 0);
  }
  else {
    local_38 = (ulong *)((long)emit_context + 0x28);
    uVar5 = *(ulong *)((long)emit_context + 0x28);
    if (len <= uVar5) {
      pvVar3 = *(void **)((long)emit_context + 0x20);
      *(size_t *)((long)emit_context + 0x20) = (long)pvVar3 + len;
LAB_0010788d:
      *local_38 = uVar5 - len;
      if (iov_count != 0) {
        do {
          memcpy(pvVar3,iov->iov_base,iov->iov_len);
          pvVar3 = (void *)((long)pvVar3 + iov->iov_len);
          iov = iov + 1;
          iov_count = iov_count + -1;
        } while (iov_count != 0);
        return 0;
      }
      return 0;
    }
    if (iov_count == 0) {
      return 0;
    }
    do {
      uVar5 = iov->iov_len;
      if (uVar5 != 0) {
        local_40 = iov->iov_base;
        bVar9 = false;
        do {
          uVar6 = *local_38;
          while ((__n = uVar5, uVar6 < uVar5 && (__n = uVar6, uVar6 == 0))) {
            lVar1 = *(long *)((long)emit_context + 8);
            if ((lVar1 == 0) || (pvVar3 = *(void **)(lVar1 + 0xb80), pvVar3 == *emit_context)) {
              pvVar3 = malloc(0xb98);
              if (pvVar3 == (void *)0x0) {
                return -1;
              }
              *(long *)((long)emit_context + 0x38) = *(long *)((long)emit_context + 0x38) + 0xb80;
              if (lVar1 != 0) {
                *(long *)((long)pvVar3 + 0xb88) = lVar1;
                lVar2 = *emit_context;
                *(long *)((long)pvVar3 + 0xb80) = lVar2;
                *(void **)(lVar2 + 0xb88) = pvVar3;
                *(void **)(lVar1 + 0xb80) = pvVar3;
                goto LAB_0010761f;
              }
              *(void **)emit_context = pvVar3;
              *(void **)((long)emit_context + 8) = pvVar3;
              *(void **)((long)pvVar3 + 0xb80) = pvVar3;
              *(void **)((long)pvVar3 + 0xb88) = pvVar3;
              uVar6 = 0x5c0;
              *(long *)((long)emit_context + 0x10) = (long)pvVar3 + 0x5c0;
              *(long *)((long)emit_context + 0x20) = (long)pvVar3 + 0x5c0;
              *(undefined8 *)((long)emit_context + 0x18) = 0x5c0;
              *(undefined8 *)((long)emit_context + 0x28) = 0x5c0;
              iVar4 = -0x5c0;
            }
            else {
LAB_0010761f:
              *(void **)((long)emit_context + 8) = pvVar3;
              *(void **)((long)emit_context + 0x20) = pvVar3;
              *(undefined8 *)((long)emit_context + 0x28) = 0xb80;
              iVar4 = *(int *)(*(long *)((long)pvVar3 + 0xb88) + 0xb90) + 0xb80;
              uVar6 = 0xb80;
            }
            *(int *)((long)pvVar3 + 0xb90) = iVar4;
            if (bVar9) goto LAB_001076c7;
          }
          memcpy(*(void **)((long)emit_context + 0x20),local_40,__n);
          *(long *)((long)emit_context + 0x20) = *(long *)((long)emit_context + 0x20) + __n;
          *(long *)((long)emit_context + 0x28) = *(long *)((long)emit_context + 0x28) - __n;
          local_40 = (void *)((long)local_40 + __n);
          uVar5 = uVar5 - __n;
          bVar9 = uVar5 == 0;
        } while (!bVar9);
      }
LAB_001076c7:
      iov_count = iov_count + -1;
      iov = iov + 1;
    } while (iov_count != 0);
  }
  return 0;
}

Assistant:

int flatcc_emitter(void *emit_context,
        const flatcc_iovec_t *iov, int iov_count,
        flatbuffers_soffset_t offset, size_t len)
{
    flatcc_emitter_t *E = emit_context;
    uint8_t *p;

    E->used += len;
    if (offset < 0) {
        if (len <= E->front_left) {
            E->front_cursor -= len;
            E->front_left -= len;
            p = E->front_cursor;
            goto copy;
        }
        iov += iov_count;
        while (iov_count--) {
            --iov;
            if (copy_front(E, iov->iov_base, iov->iov_len)) {
                return -1;
            }
        }
    } else {
        if (len <= E->back_left) {
            p = E->back_cursor;
            E->back_cursor += len;
            E->back_left -= len;
            goto copy;
        }
        while (iov_count--) {
            if (copy_back(E, iov->iov_base, iov->iov_len)) {
                return -1;
            }
            ++iov;
        }
    }
    return 0;
copy:
    while (iov_count--) {
        memcpy(p, iov->iov_base, iov->iov_len);
        p += iov->iov_len;
        ++iov;
    }
    return 0;
}